

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int key_schedule_extract(ptls_key_schedule_t *sched,ptls_iovec_t ikm)

{
  ptls_hash_algorithm_t *ppVar1;
  size_t outlen;
  ptls_iovec_t hash_value;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  uint8_t *puVar5;
  ptls_iovec_t secret;
  ptls_iovec_t salt;
  ptls_iovec_t ikm_00;
  
  sVar4 = ikm.len;
  puVar5 = ikm.base;
  if (puVar5 == (uint8_t *)0x0) {
    sVar4 = (sched->hashes[0].algo)->digest_size;
    puVar5 = "";
  }
  if (sched->generation == 0) {
    uVar3 = 1;
  }
  else {
    ppVar1 = sched->hashes[0].algo;
    outlen = ppVar1->digest_size;
    hash_value.len = outlen;
    hash_value.base = ppVar1->empty_digest;
    secret.len = outlen;
    secret.base = sched->secret;
    iVar2 = hkdf_expand_label(ppVar1,sched->secret,outlen,secret,"derived",hash_value,
                              sched->hkdf_label_prefix);
    if (iVar2 != 0) {
      return iVar2;
    }
    uVar3 = sched->generation + 1;
  }
  sched->generation = uVar3;
  ppVar1 = sched->hashes[0].algo;
  salt.len = ppVar1->digest_size;
  salt.base = sched->secret;
  ikm_00.len = sVar4;
  ikm_00.base = puVar5;
  iVar2 = ptls_hkdf_extract(ppVar1,sched->secret,salt,ikm_00);
  return iVar2;
}

Assistant:

static int key_schedule_extract(ptls_key_schedule_t *sched, ptls_iovec_t ikm)
{
    int ret;

    if (ikm.base == NULL)
        ikm = ptls_iovec_init(zeroes_of_max_digest_size, sched->hashes[0].algo->digest_size);

    if (sched->generation != 0 &&
        (ret = hkdf_expand_label(sched->hashes[0].algo, sched->secret, sched->hashes[0].algo->digest_size,
                                 ptls_iovec_init(sched->secret, sched->hashes[0].algo->digest_size), "derived",
                                 ptls_iovec_init(sched->hashes[0].algo->empty_digest, sched->hashes[0].algo->digest_size),
                                 sched->hkdf_label_prefix)) != 0)
        return ret;

    ++sched->generation;
    ret = ptls_hkdf_extract(sched->hashes[0].algo, sched->secret,
                            ptls_iovec_init(sched->secret, sched->hashes[0].algo->digest_size), ikm);
    PTLS_DEBUGF("%s: %u, %02x%02x\n", __FUNCTION__, sched->generation, (int)sched->secret[0], (int)sched->secret[1]);
    return ret;
}